

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Gridded_Data_PDU::Decode(Gridded_Data_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *pKVar2;
  KDataStream *pKVar3;
  GridAxisRegular *this_00;
  GridAxisIrregular *this_01;
  GridDataType0 *this_02;
  GridDataType1 *this_03;
  GridDataType2 *this_04;
  int iVar4;
  allocator<char> local_111;
  KString local_110;
  KRef_Ptr<KDIS::DATA_TYPE::GridData> local_f0;
  KRef_Ptr<KDIS::DATA_TYPE::GridData> local_d8;
  KRef_Ptr<KDIS::DATA_TYPE::GridData> local_c0;
  undefined1 local_a5;
  unsigned_short local_a4;
  unsigned_short local_a2;
  undefined1 local_a0 [3];
  KUINT8 j;
  KUINT16 DtRep;
  KUINT16 SmpTyp;
  KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> local_88;
  byte local_6d;
  uchar local_6c;
  uchar local_6b;
  unsigned_short local_6a;
  KUINT8 i;
  KUINT8 AxisType;
  KUINT8 InterleafFactor;
  KFLOAT64 KStack_68;
  KUINT16 PointsXi;
  KFLOAT64 FinalXi;
  KFLOAT64 InitialXi;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Gridded_Data_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar4 = 0;
  if ((local_19 & 1) != 0) {
    iVar4 = 0xc;
  }
  if ((uint)KVar1 + iVar4 < 0x40) {
    InitialXi._3_1_ = 1;
    pKVar2 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(pKVar2,&local_40,2);
    InitialXi._3_1_ = 0;
    __cxa_throw(pKVar2,&KException::typeinfo,KException::~KException);
  }
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  ::clear(&this->m_vpGridAxisDesc);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ::clear(&this->m_vGridData);
  Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar3 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_EnvProcID);
  pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui16FieldNum);
  pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui16PDUNum);
  pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui16PDUTotal);
  pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui16CordSys);
  pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui8NumAxis);
  pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui8ConstGrid);
  pKVar3 = DATA_TYPE::operator>>(pKVar3,&(this->m_EnvType).super_DataTypeBase);
  pKVar3 = DATA_TYPE::operator>>(pKVar3,&(this->m_Ori).super_DataTypeBase);
  pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui64SampleTime);
  pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui32TotalValues);
  pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui8VecDim);
  pKVar3 = KDataStream::operator>>(pKVar3,&this->m_ui16Padding1);
  KDataStream::operator>>(pKVar3,&this->m_ui8Padding1);
  FinalXi = 0.0;
  KStack_68 = 0.0;
  local_6a = 0;
  local_6b = '\0';
  local_6c = '\0';
  for (local_6d = 0; local_6d < this->m_ui8NumAxis; local_6d = local_6d + 1) {
    pKVar3 = KDataStream::operator>>(pKStack_18,(double *)&FinalXi);
    pKVar3 = KDataStream::operator>>(pKVar3,(double *)&stack0xffffffffffffff98);
    pKVar3 = KDataStream::operator>>(pKVar3,&local_6a);
    pKVar3 = KDataStream::operator>>(pKVar3,&local_6b);
    KDataStream::operator>>(pKVar3,&local_6c);
    if (local_6c == '\0') {
      this_00 = (GridAxisRegular *)operator_new(0x20);
      DATA_TYPE::GridAxisRegular::GridAxisRegular
                (this_00,FinalXi,KStack_68,local_6a,local_6b,local_6c,pKStack_18);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>::KRef_Ptr(&local_88,this_00);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
      ::push_back(&this->m_vpGridAxisDesc,&local_88);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>::~KRef_Ptr(&local_88);
    }
    else {
      this_01 = (GridAxisIrregular *)operator_new(0x60);
      DATA_TYPE::GridAxisIrregular::GridAxisIrregular
                (this_01,FinalXi,KStack_68,local_6a,local_6b,local_6c,pKStack_18);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>::KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)local_a0,(GridAxisRegular *)this_01);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
      ::push_back(&this->m_vpGridAxisDesc,(KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)local_a0);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>::~KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)local_a0);
    }
  }
  local_a2 = 0;
  local_a4 = 0;
  local_a5 = 0;
  if (this->m_ui8VecDim == '\0') {
    return;
  }
  pKVar3 = KDataStream::operator>>(pKStack_18,&local_a2);
  KDataStream::operator>>(pKVar3,&local_a4);
  if (local_a4 == 0) {
    this_02 = (GridDataType0 *)operator_new(0x30);
    DATA_TYPE::GridDataType0::GridDataType0(this_02,local_a2,local_a4,pKStack_18);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::KRef_Ptr(&local_c0,(GridData *)this_02);
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
    ::push_back(&this->m_vGridData,&local_c0);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::~KRef_Ptr(&local_c0);
LAB_001d83ec:
    this_03 = (GridDataType1 *)operator_new(0x38);
    DATA_TYPE::GridDataType1::GridDataType1(this_03,local_a2,local_a4,pKStack_18);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::KRef_Ptr(&local_d8,(GridData *)this_03);
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
    ::push_back(&this->m_vGridData,&local_d8);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::~KRef_Ptr(&local_d8);
  }
  else {
    if (local_a4 == 1) goto LAB_001d83ec;
    if (local_a4 != 2) goto LAB_001d84ea;
  }
  this_04 = (GridDataType2 *)operator_new(0x30);
  DATA_TYPE::GridDataType2::GridDataType2(this_04,local_a2,local_a4,pKStack_18);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::KRef_Ptr(&local_f0,(GridData *)this_04);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ::push_back(&this->m_vGridData,&local_f0);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::~KRef_Ptr(&local_f0);
LAB_001d84ea:
  pKVar2 = (KException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"Decode",&local_111);
  KException::KException<char_const*>(pKVar2,&local_110,9,"Unknown Grid Data Representation");
  __cxa_throw(pKVar2,&KException::typeinfo,KException::~KException);
}

Assistant:

void Gridded_Data_PDU::Decode(KDataStream &stream, bool ignoreHeader) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < GRIDDED_DATA_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vpGridAxisDesc.clear();
    m_vGridData.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EnvProcID
           >> m_ui16FieldNum
           >> m_ui16PDUNum
           >> m_ui16PDUTotal
           >> m_ui16CordSys
           >> m_ui8NumAxis
           >> m_ui8ConstGrid
           >> KDIS_STREAM m_EnvType
           >> KDIS_STREAM m_Ori
           >> m_ui64SampleTime
           >> m_ui32TotalValues
           >> m_ui8VecDim
           >> m_ui16Padding1
           >> m_ui8Padding1;

    // We must first decode 4 other values before we can get to the grid axis type so
    // a special constructor is provided in the grid axis classes so that we can pass half the decoded data.
    KFLOAT64 InitialXi = 0;
    KFLOAT64 FinalXi = 0;
    KUINT16 PointsXi = 0;
    KUINT8 InterleafFactor = 0;
    KUINT8 AxisType = 0;
    for( KUINT8 i = 0; i < m_ui8NumAxis; ++i )
    {
        stream >> InitialXi
               >> FinalXi
               >> PointsXi
               >> InterleafFactor
               >> AxisType;

        if( AxisType == 0 )
        {
            // Regular grid
            m_vpGridAxisDesc.push_back( new GridAxisRegular( InitialXi, FinalXi, PointsXi, InterleafFactor, AxisType, stream ) );
        }
        else
        {
            // Irregular grid.
            m_vpGridAxisDesc.push_back( new GridAxisIrregular( InitialXi, FinalXi, PointsXi, InterleafFactor, AxisType, stream ) );
        }
    }

    // We must first decode 2 other values before we can get to the grid data type so
    // a special constructor is provided in the grid data type classes so that we can pass half the decoded data.
    KUINT16 SmpTyp = 0;
    KUINT16 DtRep = 0;

    for( KUINT8 j = 0; j < m_ui8VecDim; ++j )
    {
        stream >> SmpTyp
               >> DtRep;

        switch( DtRep )
        {
        case 0:
            m_vGridData.push_back( new GridDataType0( SmpTyp, DtRep, stream ) );
        case 1 :
            m_vGridData.push_back( new GridDataType1( SmpTyp, DtRep, stream ) );
        case 2:
            m_vGridData.push_back( new GridDataType2( SmpTyp, DtRep, stream ) );
        default:
            throw KException( __FUNCTION__, UNSUPPORTED_DATATYPE, "Unknown Grid Data Representation" );
        }
    }
}